

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Crop_x86_avx512::forward
          (Crop_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 *puVar1;
  Mat *pMVar2;
  pointer pMVar3;
  int *piVar4;
  void *pvVar5;
  long *plVar6;
  Allocator *pAVar7;
  ulong uVar8;
  size_t sVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined8 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  bool bVar36;
  int iVar37;
  Allocator *pAVar38;
  pointer pMVar39;
  int iVar40;
  sbyte sVar41;
  long lVar42;
  ulong uVar43;
  Mat *pMVar44;
  long lVar45;
  uint uVar46;
  int iVar47;
  int *unaff_R14;
  bool bVar48;
  bool bVar49;
  int _outw;
  Mat m;
  int _outh;
  int _woffset;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blob_shapes;
  int iStack_110;
  Allocator *pAStack_108;
  int iStack_100;
  int iStack_fc;
  int iStack_f8;
  int iStack_f4;
  int iStack_f0;
  size_t local_e8;
  int _outd;
  int _outc;
  int _hoffset;
  uint local_d4;
  Mat *local_d0;
  int local_c8;
  uint local_c4;
  Option *local_c0;
  int _coffset;
  int local_b4;
  size_t local_b0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs_unpacked;
  int _doffset;
  Crop *local_50;
  int local_48;
  int local_44;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_40;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_38;
  
  pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_d4 = pMVar2->w;
  local_c4 = pMVar2->h;
  local_48 = pMVar2->d;
  local_b4 = pMVar2->c;
  local_c8 = pMVar2->dims;
  local_b0 = pMVar2->elemsize;
  local_44 = pMVar2->elempack;
  pMVar44 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_d0 = pMVar44;
  local_c0 = opt;
  local_40 = bottom_blobs;
  local_38 = top_blobs;
  if (((this->super_Crop).starts_expr._M_string_length != 0) &&
     ((this->super_Crop).ends_expr._M_string_length != 0)) {
    local_50 = &this->super_Crop;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&bottom_blob_shapes,
               ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,
               (allocator_type *)&m);
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      unaff_R14 = (int *)0x0;
      uVar43 = 0;
      do {
        pMVar39 = bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        switch(*(undefined4 *)((long)&pMVar3->dims + (long)unaff_R14)) {
        case 1:
          m.cstep = (long)*(int *)((long)&pMVar3->elempack + (long)unaff_R14) *
                    (long)*(int *)((long)&pMVar3->w + (long)unaff_R14);
          m.dims = 1;
          m.w = (int)m.cstep;
          m.h = 1;
          m.d = 1;
          m.c = 1;
          break;
        case 2:
          m.w = *(int *)((long)&pMVar3->w + (long)unaff_R14);
          lVar45 = (long)*(int *)((long)&pMVar3->elempack + (long)unaff_R14) *
                   (long)*(int *)((long)&pMVar3->h + (long)unaff_R14);
          m.dims = 2;
          m.h = (int)lVar45;
          m.d = 1;
          m.c = 1;
          m.cstep = lVar45 * m.w;
          break;
        case 3:
          m.w = *(int *)((long)&pMVar3->w + (long)unaff_R14);
          m.h = *(int *)((long)&pMVar3->h + (long)unaff_R14);
          m.c = *(int *)((long)&pMVar3->elempack + (long)unaff_R14) *
                *(int *)((long)&pMVar3->c + (long)unaff_R14);
          m.dims = 3;
          m.d = 1;
          lVar45 = (long)m.h * (long)m.w;
          goto LAB_00287ab5;
        case 4:
          m.w = *(int *)((long)&pMVar3->w + (long)unaff_R14);
          m.h = *(int *)((long)&pMVar3->h + (long)unaff_R14);
          m.c = *(int *)((long)&pMVar3->elempack + (long)unaff_R14) *
                *(int *)((long)&pMVar3->c + (long)unaff_R14);
          m.d = *(int *)((long)&pMVar3->d + (long)unaff_R14);
          m.dims = 4;
          lVar45 = (long)m.h * (long)m.w * (long)m.d;
LAB_00287ab5:
          m.cstep = (lVar45 * 4 + 0xfU & 0xfffffffffffffff0) >> 2;
          break;
        default:
          m.cstep = 0;
          m.elemsize._0_4_ = 0;
          m.elempack = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          m.dims = 0;
          m.w = 0;
          goto LAB_00287b22;
        }
        m.elemsize._0_4_ = 4;
        m.elempack = 1;
LAB_00287b22:
        m.elemsize._4_4_ = 0;
        m.refcount._4_4_ = 0;
        m.refcount._0_4_ = 0;
        m.allocator = (Allocator *)0x0;
        m.data = (void *)0x0;
        pMVar44 = (Mat *)((long)unaff_R14 +
                         (long)bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start);
        if (pMVar44 != &m) {
          piVar4 = *(int **)((long)&(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->refcount +
                            (long)unaff_R14);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = *(void **)((long)&(bottom_blob_shapes.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->data +
                                 (long)unaff_R14);
              plVar6 = *(long **)((long)&(bottom_blob_shapes.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->allocator +
                                 (long)unaff_R14);
              if (plVar6 == (long *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (**(code **)(*plVar6 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&pMVar39->cstep + (long)unaff_R14) = 0;
          *(undefined8 *)((long)&pMVar44->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar44->elemsize + 4) = 0;
          pMVar44->data = (void *)0x0;
          pMVar44->refcount = (int *)0x0;
          puVar1 = (undefined8 *)((long)&pMVar39->dims + (long)unaff_R14);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)((long)&pMVar39->c + (long)unaff_R14) = 0;
          puVar1 = (undefined8 *)((long)&pMVar39->data + (long)unaff_R14);
          *puVar1 = m.data;
          puVar1[1] = CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          *(ulong *)((long)&pMVar39->elemsize + (long)unaff_R14) =
               CONCAT44(m.elemsize._4_4_,(int)m.elemsize);
          *(int *)((long)&pMVar39->elempack + (long)unaff_R14) = m.elempack;
          *(Allocator **)((long)&pMVar39->allocator + (long)unaff_R14) = m.allocator;
          puVar1 = (undefined8 *)((long)&pMVar39->dims + (long)unaff_R14);
          *puVar1 = CONCAT44(m.w,m.dims);
          puVar1[1] = CONCAT44(m.d,m.h);
          *(int *)((long)&pMVar39->c + (long)unaff_R14) = m.c;
          *(size_t *)((long)&pMVar39->cstep + (long)unaff_R14) = m.cstep;
        }
        bottom_blobs = local_40;
        piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m.cstep = 0;
        m.data = (void *)0x0;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = 0;
        m.elemsize._4_4_ = 0;
        m.elempack = 0;
        m.dims = 0;
        m.w = 0;
        m.h = 0;
        m.d = 0;
        m.c = 0;
        uVar43 = uVar43 + 1;
        unaff_R14 = unaff_R14 + 0x12;
      } while (uVar43 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x71c71c71c71c71c7));
    }
    this = (Crop_x86_avx512 *)local_50;
    Crop::eval_crop_expr
              (local_50,&bottom_blob_shapes,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,
               &_outd,&_outc);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blob_shapes);
    pMVar44 = local_d0;
    goto LAB_00287d32;
  }
  if ((this->super_Crop).woffset != -0xe9) {
    switch(pMVar2->dims) {
    case 1:
      m.cstep = (long)pMVar2->elempack * (long)pMVar2->w;
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
      m.dims = 1;
      m.w = (int)m.cstep;
      m.h = 1;
      m.d = 1;
      m.c = 1;
      break;
    case 2:
      m.w = pMVar2->w;
      lVar45 = (long)pMVar2->elempack * (long)pMVar2->h;
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
      m.dims = 2;
      m.h = (int)lVar45;
      m.d = 1;
      m.c = 1;
      m.cstep = lVar45 * m.w;
      break;
    case 3:
      m.w = pMVar2->w;
      m.h = pMVar2->h;
      m.c = pMVar2->elempack * pMVar2->c;
      m.dims = 3;
      m.d = 1;
      lVar45 = (long)m.h * (long)m.w;
      goto LAB_002880f5;
    case 4:
      m.w = pMVar2->w;
      m.h = pMVar2->h;
      m.d = pMVar2->d;
      m.c = pMVar2->elempack * pMVar2->c;
      m.dims = 4;
      lVar45 = (long)m.h * (long)m.w * (long)m.d;
LAB_002880f5:
      m.elempack = 1;
      m.elemsize._0_4_ = 4;
      m.cstep = lVar45 + 3U & 0x3ffffffffffffffc;
      break;
    default:
      m.cstep = 0;
      m.elemsize._0_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
    }
    m.elemsize._4_4_ = 0;
    m.refcount._4_4_ = 0;
    m.refcount._0_4_ = 0;
    m.allocator = (Allocator *)0x0;
    m.data = (void *)0x0;
    switch(pMVar2[1].dims) {
    case 1:
      local_e8 = (long)pMVar2[1].elempack * (long)pMVar2[1].w;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
      iStack_110 = 1;
      iStack_100 = 1;
      iStack_fc = (int)local_e8;
      iStack_f8 = 1;
      iStack_f4 = 1;
      iStack_f0 = 1;
      break;
    case 2:
      iStack_fc = pMVar2[1].w;
      lVar45 = (long)pMVar2[1].elempack * (long)pMVar2[1].h;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
      iStack_110 = 1;
      iStack_100 = 2;
      iStack_f8 = (int)lVar45;
      iStack_f4 = 1;
      iStack_f0 = 1;
      local_e8 = lVar45 * iStack_fc;
      break;
    case 3:
      iStack_fc = pMVar2[1].w;
      iStack_f8 = pMVar2[1].h;
      iStack_f0 = pMVar2[1].elempack * pMVar2[1].c;
      iStack_100 = 3;
      iStack_f4 = 1;
      lVar45 = (long)iStack_f8 * (long)iStack_fc;
      goto LAB_00288413;
    case 4:
      iStack_fc = pMVar2[1].w;
      iStack_f8 = pMVar2[1].h;
      iStack_f4 = pMVar2[1].d;
      iStack_f0 = pMVar2[1].elempack * pMVar2[1].c;
      iStack_100 = 4;
      lVar45 = (long)iStack_f8 * (long)iStack_fc * (long)iStack_f4;
LAB_00288413:
      iStack_110 = 1;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
      local_e8 = lVar45 + 3U & 0x3ffffffffffffffc;
      break;
    default:
      local_e8 = 0;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      iStack_110 = 0;
      iStack_100 = 0;
      iStack_fc = 0;
      iStack_f8 = 0;
      iStack_f4 = 0;
      iStack_f0 = 0;
    }
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    pAStack_108 = (Allocator *)0x0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    unaff_R14 = &_coffset;
    Crop::resolve_crop_roi
              (&this->super_Crop,&m,(Mat *)&bottom_blob_shapes,&_woffset,&_hoffset,&_doffset,
               unaff_R14,&_outw,&_outh,&_outd,&_outc);
    piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish._4_4_,
                             bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if ((*piVar4 == 0) &&
         (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0)) {
        free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start);
      }
    }
    piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 != 0) goto LAB_00287d32;
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        goto LAB_00287d32;
      }
      if (m.data == (void *)0x0) goto LAB_00287d32;
      goto LAB_002885a4;
    }
    goto LAB_00287d32;
  }
  switch(pMVar2->dims) {
  case 1:
    m.cstep = (long)pMVar2->elempack * (long)pMVar2->w;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 1;
    m.w = (int)m.cstep;
    m.h = 1;
    m.d = 1;
    m.c = 1;
    break;
  case 2:
    m.w = pMVar2->w;
    lVar45 = (long)pMVar2->elempack * (long)pMVar2->h;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 2;
    m.h = (int)lVar45;
    m.d = 1;
    m.c = 1;
    m.cstep = lVar45 * m.w;
    break;
  case 3:
    m.w = pMVar2->w;
    m.h = pMVar2->h;
    m.c = pMVar2->elempack * pMVar2->c;
    m.dims = 3;
    m.d = 1;
    lVar45 = (long)m.h * (long)m.w;
    goto LAB_0028807c;
  case 4:
    m.w = pMVar2->w;
    m.h = pMVar2->h;
    m.d = pMVar2->d;
    m.c = pMVar2->elempack * pMVar2->c;
    m.dims = 4;
    lVar45 = (long)m.h * (long)m.w * (long)m.d;
LAB_0028807c:
    m.elempack = 1;
    m.elemsize._0_4_ = 4;
    m.cstep = lVar45 + 3U & 0x3ffffffffffffffc;
    break;
  default:
    m.cstep = 0;
    m.elemsize._0_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  m.elemsize._4_4_ = 0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.allocator = (Allocator *)0x0;
  m.data = (void *)0x0;
  unaff_R14 = &_coffset;
  Crop::resolve_crop_roi
            (&this->super_Crop,&m,(int *)pMVar2[1].data,&_woffset,&_hoffset,&_doffset,unaff_R14,
             &_outw,&_outh,&_outd,&_outc);
  piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
LAB_002885a4:
          unaff_R14 = &_coffset;
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00287d32:
  iVar40 = (int)unaff_R14;
  if (local_44 == 0x10) {
    if (local_c8 == 1) {
      if ((_outw & 0xfU) == 0) {
        uVar43 = 0x10;
      }
      else if ((_outw & 7U) == 0) {
        uVar43 = 8;
      }
      else {
        uVar43 = (ulong)((uint)((_outw & 3U) == 0) * 3 + 1);
      }
      iVar47 = (int)uVar43;
      if (iVar47 == 0x10 && _outw / iVar47 == local_d4) {
        if (pMVar44 != pMVar2) {
          piVar4 = pMVar2->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = pMVar44->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (pMVar44->allocator == (Allocator *)0x0) {
                if (pMVar44->data != (void *)0x0) {
                  free(pMVar44->data);
                }
              }
              else {
                (*pMVar44->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar44->cstep = 0;
          pMVar44->data = (void *)0x0;
          pMVar44->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar44->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar44->elemsize + 4) = 0;
          pMVar44->dims = 0;
          pMVar44->w = 0;
          pMVar44->h = 0;
          pMVar44->d = 0;
          pMVar44->c = 0;
          piVar4 = pMVar2->refcount;
          pMVar44->data = pMVar2->data;
          pMVar44->refcount = piVar4;
          pMVar44->elemsize = pMVar2->elemsize;
          pMVar44->elempack = pMVar2->elempack;
          pMVar44->allocator = pMVar2->allocator;
          iVar40 = pMVar2->w;
          iVar47 = pMVar2->h;
          iVar37 = pMVar2->d;
          pMVar44->dims = pMVar2->dims;
          pMVar44->w = iVar40;
          pMVar44->h = iVar47;
          pMVar44->d = iVar37;
          pMVar44->c = pMVar2->c;
          pMVar44->cstep = pMVar2->cstep;
        }
LAB_00288621:
        bVar48 = false;
        iVar40 = 0;
      }
      else {
        bVar48 = true;
        if ((iVar47 == 0x10) && ((_woffset & 0xfU) == 0)) {
          Mat::create(pMVar44,_outw / iVar47,uVar43 * (local_b0 >> 4),0x10,local_c0->blob_allocator)
          ;
          iVar40 = -100;
          if (pMVar44->data == (void *)0x0) {
            bVar48 = false;
          }
          else {
            bVar48 = false;
            if ((long)pMVar44->c * pMVar44->cstep != 0) {
              iVar40 = _woffset + 0xf;
              if (-1 < _woffset) {
                iVar40 = _woffset;
              }
              crop_pack16_avx512(pMVar2,pMVar44,0,iVar40 >> 4);
              goto LAB_00288621;
            }
          }
        }
      }
      if (!bVar48) {
        return iVar40;
      }
    }
    if (local_c8 == 2) {
      if ((_outh & 0xfU) == 0) {
        uVar43 = 0x10;
      }
      else if ((_outh & 7U) == 0) {
        uVar43 = 8;
      }
      else {
        uVar43 = (ulong)((uint)((_outh & 3U) == 0) * 3 + 1);
      }
      iVar47 = (int)uVar43;
      if (_outw == local_d4) {
        if ((iVar47 != 0x10) || (_outh / iVar47 != local_c4)) goto LAB_002886d1;
        if (pMVar44 != pMVar2) {
          piVar4 = pMVar2->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = pMVar44->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = pMVar44->data;
              pAVar7 = pMVar44->allocator;
              if (pAVar7 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)_outh % (long)iVar47 & 0xffffffff)
                ;
              }
            }
          }
          pMVar44->cstep = 0;
          pMVar44->data = (void *)0x0;
          pMVar44->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar44->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar44->elemsize + 4) = 0;
          pMVar44->dims = 0;
          pMVar44->w = 0;
          pMVar44->h = 0;
          pMVar44->d = 0;
          pMVar44->c = 0;
          piVar4 = pMVar2->refcount;
          pMVar44->data = pMVar2->data;
          pMVar44->refcount = piVar4;
          pMVar44->elemsize = pMVar2->elemsize;
          pMVar44->elempack = pMVar2->elempack;
          pMVar44->allocator = pMVar2->allocator;
          iVar40 = pMVar2->w;
          iVar47 = pMVar2->h;
          iVar37 = pMVar2->d;
          pMVar44->dims = pMVar2->dims;
          pMVar44->w = iVar40;
          pMVar44->h = iVar47;
          pMVar44->d = iVar37;
          pMVar44->c = pMVar2->c;
          pMVar44->cstep = pMVar2->cstep;
        }
LAB_002887d8:
        bVar48 = false;
        iVar40 = 0;
      }
      else {
LAB_002886d1:
        bVar48 = true;
        if ((iVar47 == 0x10) && ((_hoffset & 0xfU) == 0)) {
          iVar40 = _outh + 0xf;
          if (-1 < _outh) {
            iVar40 = _outh;
          }
          Mat::create(pMVar44,_outw,iVar40 >> 4,uVar43 * (local_b0 >> 4),0x10,
                      local_c0->blob_allocator);
          iVar40 = -100;
          if (pMVar44->data == (void *)0x0) {
            bVar48 = false;
          }
          else {
            bVar48 = false;
            if ((long)pMVar44->c * pMVar44->cstep != 0) {
              iVar40 = _hoffset + 0xf;
              if (-1 < _hoffset) {
                iVar40 = _hoffset;
              }
              crop_pack16_avx512(pMVar2,pMVar44,iVar40 >> 4,_woffset);
              goto LAB_002887d8;
            }
          }
        }
      }
      if (!bVar48) {
        return iVar40;
      }
    }
    if (local_c8 == 3) {
      if ((_outc & 0xfU) == 0) {
        uVar43 = 0x10;
      }
      else if ((_outc & 7U) == 0) {
        uVar43 = 8;
      }
      else {
        uVar43 = (ulong)((uint)((_outc & 3U) == 0) * 3 + 1);
      }
      iVar47 = (int)uVar43;
      if (_outh != local_c4 || _outw != local_d4) {
LAB_00288899:
        bVar48 = true;
        if (iVar47 == 0x10 && (_coffset & 0xfU) == 0) {
          iVar40 = _outc + 0xf;
          if (-1 < _outc) {
            iVar40 = _outc;
          }
          m.c = iVar40 >> 4;
          uVar8 = pMVar2->elemsize;
          m.data = (void *)((long)(_coffset >> 4) * pMVar2->cstep * uVar8 + (long)pMVar2->data);
          m.elempack = pMVar2->elempack;
          m.allocator = pMVar2->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (int)uVar8;
          m.elemsize._4_4_ = (undefined4)(uVar8 >> 0x20);
          uVar11 = pMVar2->dims;
          uVar12 = pMVar2->w;
          uVar13 = pMVar2->h;
          uVar14 = pMVar2->d;
          m.cstep = ((long)pMVar2->d * uVar8 * (long)pMVar2->h * (long)pMVar2->w + 0xf &
                    0xfffffffffffffff0) / uVar8;
          m.dims = uVar11;
          m.w = uVar12;
          m.h = uVar13;
          m.d = uVar14;
          if (_outh != local_c4 || _outw != local_d4) {
LAB_00288af8:
            iVar40 = _outc + 0xf;
            if (-1 < _outc) {
              iVar40 = _outc;
            }
            Mat::create(pMVar44,_outw,_outh,iVar40 >> 4,uVar43 * (local_b0 >> 4),0x10,
                        local_c0->blob_allocator);
            iVar40 = -100;
            if ((pMVar44->data != (void *)0x0) && ((long)pMVar44->c * pMVar44->cstep != 0)) {
              if (pMVar44->c < 1) {
                iVar40 = 0;
              }
              else {
                lVar45 = 0;
                do {
                  pAVar7 = m.allocator;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)(m.cstep * lVar45 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize) +
                                (long)m.data);
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                  pAStack_108 = m.allocator;
                  sVar9 = local_d0->elemsize;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)(local_d0->cstep * lVar45 * sVar9 + (long)local_d0->data);
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)sVar9;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                       (undefined4)(sVar9 >> 0x20);
                  crop_pack16_avx512((Mat *)&bottom_blob_shapes,(Mat *)&bottom_blobs_unpacked,
                                     _hoffset,_woffset);
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (pAVar7 == (Allocator *)0x0) {
                        if (bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          free(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start);
                        }
                      }
                      else {
                        (*pAVar7->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_e8 = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  iStack_110 = 0;
                  iStack_100 = 0;
                  iStack_fc = 0;
                  iStack_f8 = 0;
                  iStack_f4 = 0;
                  iStack_f0 = 0;
                  lVar45 = lVar45 + 1;
                } while (lVar45 < local_d0->c);
                iVar40 = 0;
                pMVar44 = local_d0;
                bottom_blobs = local_40;
              }
            }
          }
          else {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_c0->blob_allocator,
                       (int)m.elemsize,m.allocator);
            if (pMVar44 != (Mat *)&bottom_blob_shapes) {
              piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = pMVar44->refcount;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (pMVar44->allocator == (Allocator *)0x0) {
                    if (pMVar44->data != (void *)0x0) {
                      free(pMVar44->data);
                    }
                  }
                  else {
                    (*pMVar44->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              pMVar44->cstep = 0;
              pMVar44->data = (void *)0x0;
              pMVar44->refcount = (int *)0x0;
              *(undefined8 *)((long)&pMVar44->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar44->elemsize + 4) = 0;
              pMVar44->dims = 0;
              pMVar44->w = 0;
              pMVar44->h = 0;
              pMVar44->d = 0;
              pMVar44->c = 0;
              pMVar44->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              pMVar44->refcount =
                   (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
              pMVar44->elemsize =
                   CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            (int)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
              pMVar44->elempack = iStack_110;
              pMVar44->allocator = pAStack_108;
              pMVar44->dims = iStack_100;
              pMVar44->w = iStack_fc;
              pMVar44->h = iStack_f8;
              pMVar44->d = iStack_f4;
              pMVar44->c = iStack_f0;
              pMVar44->cstep = local_e8;
            }
            piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (pAStack_108 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*pAStack_108->_vptr_Allocator[3])();
                }
              }
            }
            iVar40 = -100;
            if ((pMVar44->data != (void *)0x0) && ((long)pMVar44->c * pMVar44->cstep != 0))
            goto LAB_00288af8;
          }
          piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          bVar48 = false;
        }
      }
      else {
        if ((iVar47 != 0x10) || (_outc / iVar47 != local_b4)) goto LAB_00288899;
        if (pMVar44 != pMVar2) {
          piVar4 = pMVar2->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = pMVar44->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = pMVar44->data;
              pAVar7 = pMVar44->allocator;
              if (pAVar7 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)_outc % (long)iVar47 & 0xffffffff)
                ;
              }
            }
          }
          pMVar44->cstep = 0;
          pMVar44->data = (void *)0x0;
          pMVar44->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar44->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar44->elemsize + 4) = 0;
          pMVar44->dims = 0;
          pMVar44->w = 0;
          pMVar44->h = 0;
          pMVar44->d = 0;
          pMVar44->c = 0;
          piVar4 = pMVar2->refcount;
          pMVar44->data = pMVar2->data;
          pMVar44->refcount = piVar4;
          pMVar44->elemsize = pMVar2->elemsize;
          pMVar44->elempack = pMVar2->elempack;
          pMVar44->allocator = pMVar2->allocator;
          iVar40 = pMVar2->w;
          iVar47 = pMVar2->h;
          iVar37 = pMVar2->d;
          pMVar44->dims = pMVar2->dims;
          pMVar44->w = iVar40;
          pMVar44->h = iVar47;
          pMVar44->d = iVar37;
          pMVar44->c = pMVar2->c;
          pMVar44->cstep = pMVar2->cstep;
        }
        bVar48 = false;
        iVar40 = 0;
      }
      if (!bVar48) {
        return iVar40;
      }
    }
    if (local_c8 == 4) {
      if ((_outc & 0xfU) == 0) {
        uVar43 = 0x10;
      }
      else if ((_outc & 7U) == 0) {
        uVar43 = 8;
      }
      else {
        uVar43 = (ulong)((uint)((_outc & 3U) == 0) * 3 + 1);
      }
      bVar48 = _outd != local_48 || (_outh != local_c4 || _outw != local_d4);
      iVar47 = (int)uVar43;
      if (bVar48) {
LAB_00288f0f:
        bVar49 = true;
        if (iVar47 == 0x10 && (_coffset & 0xfU) == 0) {
          iVar40 = _outc + 0xf;
          if (-1 < _outc) {
            iVar40 = _outc;
          }
          m.c = iVar40 >> 4;
          uVar8 = pMVar2->elemsize;
          m.data = (void *)((long)(_coffset >> 4) * pMVar2->cstep * uVar8 + (long)pMVar2->data);
          m.elempack = pMVar2->elempack;
          m.allocator = pMVar2->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (int)uVar8;
          m.elemsize._4_4_ = (undefined4)(uVar8 >> 0x20);
          uVar24 = pMVar2->dims;
          uVar25 = pMVar2->w;
          uVar26 = pMVar2->h;
          uVar27 = pMVar2->d;
          m.cstep = ((long)pMVar2->d * uVar8 * (long)pMVar2->h * (long)pMVar2->w + 0xf &
                    0xfffffffffffffff0) / uVar8;
          m.dims = uVar24;
          m.w = uVar25;
          m.h = uVar26;
          m.d = uVar27;
          if (bVar48) {
LAB_0028916e:
            iVar40 = _outc + 0xf;
            if (-1 < _outc) {
              iVar40 = _outc;
            }
            Mat::create(pMVar44,_outw,_outh,_outd,iVar40 >> 4,uVar43 * (local_b0 >> 4),0x10,
                        local_c0->blob_allocator);
            iVar40 = -100;
            if ((pMVar44->data != (void *)0x0) && ((long)pMVar44->c * pMVar44->cstep != 0)) {
              if (pMVar44->c < 1) {
                iVar40 = 0;
              }
              else {
                lVar45 = 0;
                local_50 = &this->super_Crop;
                do {
                  if (0 < _outd) {
                    lVar42 = 0;
                    do {
                      pAVar38 = m.allocator;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start =
                           (pointer)((long)m.data +
                                    (long)(_doffset + (int)lVar42) *
                                    CONCAT44(m.elemsize._4_4_,(int)m.elemsize) *
                                    (long)m.h * (long)m.w +
                                    m.cstep * lVar45 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize));
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                      pAStack_108 = m.allocator;
                      sVar9 = local_d0->elemsize;
                      pAVar7 = local_d0->allocator;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           (pointer)((long)local_d0->data +
                                    lVar42 * sVar9 * (long)local_d0->h * (long)local_d0->w +
                                    local_d0->cstep * lVar45 * sVar9);
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)sVar9;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)(sVar9 >> 0x20);
                      crop_pack16_avx512((Mat *)&bottom_blob_shapes,(Mat *)&bottom_blobs_unpacked,
                                         _hoffset,_woffset);
                      piVar4 = (int *)CONCAT44(bottom_blobs_unpacked.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                               bottom_blobs_unpacked.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                      if (piVar4 != (int *)0x0) {
                        LOCK();
                        *piVar4 = *piVar4 + -1;
                        UNLOCK();
                        if (*piVar4 == 0) {
                          if (pAVar7 == (Allocator *)0x0) {
                            if (bottom_blobs_unpacked.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_start != (pointer)0x0) {
                              free(bottom_blobs_unpacked.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start);
                            }
                          }
                          else {
                            (*pAVar7->_vptr_Allocator[3])();
                          }
                        }
                      }
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)0x0;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                      piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                               bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                      if (piVar4 != (int *)0x0) {
                        LOCK();
                        *piVar4 = *piVar4 + -1;
                        UNLOCK();
                        if (*piVar4 == 0) {
                          if (pAVar38 == (Allocator *)0x0) {
                            if (bottom_blob_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_start != (pointer)0x0) {
                              free(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start);
                            }
                          }
                          else {
                            (*pAVar38->_vptr_Allocator[3])();
                          }
                        }
                      }
                      local_e8 = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                      iStack_110 = 0;
                      iStack_100 = 0;
                      iStack_fc = 0;
                      iStack_f8 = 0;
                      iStack_f4 = 0;
                      iStack_f0 = 0;
                      lVar42 = lVar42 + 1;
                    } while (lVar42 < _outd);
                  }
                  lVar45 = lVar45 + 1;
                } while (lVar45 < local_d0->c);
                iVar40 = 0;
                pMVar44 = local_d0;
                this = (Crop_x86_avx512 *)local_50;
                bottom_blobs = local_40;
              }
            }
          }
          else {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_c0->blob_allocator,
                       (int)m.elemsize,m.allocator);
            if (pMVar44 != (Mat *)&bottom_blob_shapes) {
              piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = pMVar44->refcount;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (pMVar44->allocator == (Allocator *)0x0) {
                    if (pMVar44->data != (void *)0x0) {
                      free(pMVar44->data);
                    }
                  }
                  else {
                    (*pMVar44->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              pMVar44->cstep = 0;
              pMVar44->data = (void *)0x0;
              pMVar44->refcount = (int *)0x0;
              *(undefined8 *)((long)&pMVar44->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar44->elemsize + 4) = 0;
              pMVar44->dims = 0;
              pMVar44->w = 0;
              pMVar44->h = 0;
              pMVar44->d = 0;
              pMVar44->c = 0;
              pMVar44->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              pMVar44->refcount =
                   (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
              pMVar44->elemsize =
                   CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            (int)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
              pMVar44->elempack = iStack_110;
              pMVar44->allocator = pAStack_108;
              pMVar44->dims = iStack_100;
              pMVar44->w = iStack_fc;
              pMVar44->h = iStack_f8;
              pMVar44->d = iStack_f4;
              pMVar44->c = iStack_f0;
              pMVar44->cstep = local_e8;
            }
            piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (pAStack_108 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*pAStack_108->_vptr_Allocator[3])();
                }
              }
            }
            iVar40 = -100;
            if ((pMVar44->data != (void *)0x0) && ((long)pMVar44->c * pMVar44->cstep != 0))
            goto LAB_0028916e;
          }
          piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          bVar49 = false;
        }
      }
      else {
        if ((iVar47 != 0x10) || (_outc / iVar47 != local_b4)) goto LAB_00288f0f;
        if (pMVar44 != pMVar2) {
          piVar4 = pMVar2->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = pMVar44->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = pMVar44->data;
              pAVar7 = pMVar44->allocator;
              if (pAVar7 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)_outc % (long)iVar47 & 0xffffffff)
                ;
              }
            }
          }
          pMVar44->cstep = 0;
          pMVar44->data = (void *)0x0;
          pMVar44->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar44->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar44->elemsize + 4) = 0;
          pMVar44->dims = 0;
          pMVar44->w = 0;
          pMVar44->h = 0;
          pMVar44->d = 0;
          pMVar44->c = 0;
          piVar4 = pMVar2->refcount;
          pMVar44->data = pMVar2->data;
          pMVar44->refcount = piVar4;
          pMVar44->elemsize = pMVar2->elemsize;
          pMVar44->elempack = pMVar2->elempack;
          pMVar44->allocator = pMVar2->allocator;
          iVar40 = pMVar2->w;
          iVar47 = pMVar2->h;
          iVar37 = pMVar2->d;
          pMVar44->dims = pMVar2->dims;
          pMVar44->w = iVar40;
          pMVar44->h = iVar47;
          pMVar44->d = iVar37;
          pMVar44->c = pMVar2->c;
          pMVar44->cstep = pMVar2->cstep;
        }
        bVar49 = false;
        iVar40 = 0;
      }
      if (!bVar49) {
        return iVar40;
      }
    }
  }
  if (local_44 == 8) {
    if (local_c8 == 1) {
      uVar46 = _outw & 7;
      bVar48 = (_outw & 3U) == 0;
      iVar47 = 8;
      if (uVar46 != 0) {
        iVar47 = (uint)bVar48 * 3 + 1;
      }
      sVar41 = 3;
      if (uVar46 != 0) {
        sVar41 = bVar48 * '\x02';
      }
      if (_outw / iVar47 == local_d4 && uVar46 == 0) {
        if (pMVar44 != pMVar2) {
          piVar4 = pMVar2->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = pMVar44->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = pMVar44->data;
              pAVar7 = pMVar44->allocator;
              if (pAVar7 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)_outw % (long)iVar47 & 0xffffffff)
                ;
              }
            }
          }
          pMVar44->cstep = 0;
          pMVar44->data = (void *)0x0;
          pMVar44->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar44->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar44->elemsize + 4) = 0;
          pMVar44->dims = 0;
          pMVar44->w = 0;
          pMVar44->h = 0;
          pMVar44->d = 0;
          pMVar44->c = 0;
          piVar4 = pMVar2->refcount;
          pMVar44->data = pMVar2->data;
          pMVar44->refcount = piVar4;
          pMVar44->elemsize = pMVar2->elemsize;
          pMVar44->elempack = pMVar2->elempack;
          pMVar44->allocator = pMVar2->allocator;
          iVar40 = pMVar2->w;
          iVar47 = pMVar2->h;
          iVar37 = pMVar2->d;
          pMVar44->dims = pMVar2->dims;
          pMVar44->w = iVar40;
          pMVar44->h = iVar47;
          pMVar44->d = iVar37;
          pMVar44->c = pMVar2->c;
          pMVar44->cstep = pMVar2->cstep;
        }
LAB_00289669:
        bVar48 = false;
        iVar40 = 0;
      }
      else {
        bVar48 = true;
        if (((_outw | _woffset) & 7U) == 0) {
          Mat::create(pMVar44,_outw / iVar47,(local_b0 >> 3) << sVar41,8,local_c0->blob_allocator);
          iVar40 = -100;
          if (pMVar44->data == (void *)0x0) {
            bVar48 = false;
          }
          else {
            bVar48 = false;
            if ((long)pMVar44->c * pMVar44->cstep != 0) {
              iVar40 = _woffset + 7;
              if (-1 < _woffset) {
                iVar40 = _woffset;
              }
              crop_pack8_avx(pMVar2,pMVar44,0,iVar40 >> 3);
              goto LAB_00289669;
            }
          }
        }
      }
      if (!bVar48) {
        return iVar40;
      }
    }
    if (local_c8 == 2) {
      sVar41 = 3;
      if ((_outh & 7U) != 0) {
        sVar41 = ((_outh & 3U) == 0) * '\x02';
      }
      if (_outw == local_d4) {
        iVar47 = 8;
        if ((_outh & 7U) != 0) {
          iVar47 = (uint)((_outh & 3U) == 0) * 3 + 1;
        }
        if (((_outh & 7U) != 0) || (_outh / iVar47 != local_c4)) goto LAB_00289732;
        if (pMVar44 != pMVar2) {
          piVar4 = pMVar2->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = pMVar44->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = pMVar44->data;
              pAVar7 = pMVar44->allocator;
              if (pAVar7 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)_outh % (long)iVar47 & 0xffffffff)
                ;
              }
            }
          }
          pMVar44->cstep = 0;
          pMVar44->data = (void *)0x0;
          pMVar44->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar44->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar44->elemsize + 4) = 0;
          pMVar44->dims = 0;
          pMVar44->w = 0;
          pMVar44->h = 0;
          pMVar44->d = 0;
          pMVar44->c = 0;
          piVar4 = pMVar2->refcount;
          pMVar44->data = pMVar2->data;
          pMVar44->refcount = piVar4;
          pMVar44->elemsize = pMVar2->elemsize;
          pMVar44->elempack = pMVar2->elempack;
          pMVar44->allocator = pMVar2->allocator;
          iVar40 = pMVar2->w;
          iVar47 = pMVar2->h;
          iVar37 = pMVar2->d;
          pMVar44->dims = pMVar2->dims;
          pMVar44->w = iVar40;
          pMVar44->h = iVar47;
          pMVar44->d = iVar37;
          pMVar44->c = pMVar2->c;
          pMVar44->cstep = pMVar2->cstep;
        }
LAB_00289822:
        bVar48 = false;
        iVar40 = 0;
      }
      else {
LAB_00289732:
        bVar48 = true;
        if (((_hoffset | _outh) & 7U) == 0) {
          iVar40 = _outh + 7;
          if (-1 < _outh) {
            iVar40 = _outh;
          }
          Mat::create(pMVar44,_outw,iVar40 >> 3,(local_b0 >> 3) << sVar41,8,local_c0->blob_allocator
                     );
          iVar40 = -100;
          if (pMVar44->data == (void *)0x0) {
            bVar48 = false;
          }
          else {
            bVar48 = false;
            if ((long)pMVar44->c * pMVar44->cstep != 0) {
              iVar40 = _hoffset + 7;
              if (-1 < _hoffset) {
                iVar40 = _hoffset;
              }
              crop_pack8_avx(pMVar2,pMVar44,iVar40 >> 3,_woffset);
              goto LAB_00289822;
            }
          }
        }
      }
      if (!bVar48) {
        return iVar40;
      }
    }
    if (local_c8 == 3) {
      uVar43 = local_b0 >> 3;
      sVar41 = 3;
      if ((_outc & 7U) != 0) {
        sVar41 = ((_outc & 3U) == 0) * '\x02';
      }
      uVar46 = _outh ^ local_c4 | _outw ^ local_d4;
      bVar48 = uVar46 == 0;
      if (bVar48) {
        iVar47 = 8;
        if ((_outc & 7U) != 0) {
          iVar47 = (uint)((_outc & 3U) == 0) * 3 + 1;
        }
        if (((_outc & 7U) != 0) || (_outc / iVar47 != local_b4)) goto LAB_002898fe;
        if (pMVar44 != pMVar2) {
          piVar4 = pMVar2->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = pMVar44->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = pMVar44->data;
              pAVar7 = pMVar44->allocator;
              if (pAVar7 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)_outc % (long)iVar47 & 0xffffffff)
                ;
              }
            }
          }
          pMVar44->cstep = 0;
          pMVar44->data = (void *)0x0;
          pMVar44->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar44->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar44->elemsize + 4) = 0;
          pMVar44->dims = 0;
          pMVar44->w = 0;
          pMVar44->h = 0;
          pMVar44->d = 0;
          pMVar44->c = 0;
          piVar4 = pMVar2->refcount;
          pMVar44->data = pMVar2->data;
          pMVar44->refcount = piVar4;
          pMVar44->elemsize = pMVar2->elemsize;
          pMVar44->elempack = pMVar2->elempack;
          pMVar44->allocator = pMVar2->allocator;
          iVar40 = pMVar2->w;
          iVar47 = pMVar2->h;
          iVar37 = pMVar2->d;
          pMVar44->dims = pMVar2->dims;
          pMVar44->w = iVar40;
          pMVar44->h = iVar47;
          pMVar44->d = iVar37;
          pMVar44->c = pMVar2->c;
          pMVar44->cstep = pMVar2->cstep;
        }
        bVar49 = false;
        iVar40 = 0;
      }
      else {
LAB_002898fe:
        bVar49 = true;
        if (((_coffset | _outc) & 7U) == 0) {
          iVar40 = _coffset + 7;
          if (-1 < _coffset) {
            iVar40 = _coffset;
          }
          iVar47 = _outc + 7;
          if (-1 < _outc) {
            iVar47 = _outc;
          }
          m.c = iVar47 >> 3;
          uVar8 = pMVar2->elemsize;
          m.data = (void *)((long)(iVar40 >> 3) * pMVar2->cstep * uVar8 + (long)pMVar2->data);
          m.elempack = pMVar2->elempack;
          m.allocator = pMVar2->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (int)uVar8;
          m.elemsize._4_4_ = (undefined4)(uVar8 >> 0x20);
          uVar15 = pMVar2->dims;
          uVar16 = pMVar2->w;
          uVar17 = pMVar2->h;
          uVar18 = pMVar2->d;
          m.cstep = ((long)pMVar2->d * uVar8 * (long)pMVar2->h * (long)pMVar2->w + 0xf &
                    0xfffffffffffffff0) / uVar8;
          m.dims = uVar15;
          m.w = uVar16;
          m.h = uVar17;
          m.d = uVar18;
          if (bVar48) {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_c0->blob_allocator,
                       CONCAT31((int3)(uVar46 >> 8),bVar48),m.allocator);
            pMVar44 = local_d0;
            if (local_d0 != (Mat *)&bottom_blob_shapes) {
              piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = local_d0->refcount;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (local_d0->allocator == (Allocator *)0x0) {
                    if (local_d0->data != (void *)0x0) {
                      free(local_d0->data);
                    }
                  }
                  else {
                    (*local_d0->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              pMVar44->cstep = 0;
              pMVar44->data = (void *)0x0;
              pMVar44->refcount = (int *)0x0;
              *(undefined8 *)((long)&pMVar44->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar44->elemsize + 4) = 0;
              pMVar44->dims = 0;
              pMVar44->w = 0;
              pMVar44->h = 0;
              pMVar44->d = 0;
              pMVar44->c = 0;
              pMVar44->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              pMVar44->refcount =
                   (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
              pMVar44->elemsize =
                   CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            (int)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
              pMVar44->elempack = iStack_110;
              pMVar44->allocator = pAStack_108;
              pMVar44->dims = iStack_100;
              pMVar44->w = iStack_fc;
              pMVar44->h = iStack_f8;
              pMVar44->d = iStack_f4;
              pMVar44->c = iStack_f0;
              pMVar44->cstep = local_e8;
            }
            piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (pAStack_108 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*pAStack_108->_vptr_Allocator[3])();
                }
              }
            }
            iVar40 = -100;
            if ((pMVar44->data != (void *)0x0) && ((long)pMVar44->c * pMVar44->cstep != 0))
            goto LAB_00289b61;
          }
          else {
LAB_00289b61:
            iVar40 = _outc + 7;
            if (-1 < _outc) {
              iVar40 = _outc;
            }
            Mat::create(pMVar44,_outw,_outh,iVar40 >> 3,uVar43 << sVar41,8,local_c0->blob_allocator)
            ;
            iVar40 = -100;
            if ((pMVar44->data != (void *)0x0) && ((long)pMVar44->c * pMVar44->cstep != 0)) {
              if (pMVar44->c < 1) {
                iVar40 = 0;
              }
              else {
                lVar45 = 0;
                do {
                  pAVar7 = m.allocator;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)(m.cstep * lVar45 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize) +
                                (long)m.data);
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                  pAStack_108 = m.allocator;
                  sVar9 = local_d0->elemsize;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)(local_d0->cstep * lVar45 * sVar9 + (long)local_d0->data);
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)sVar9;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                       (undefined4)(sVar9 >> 0x20);
                  crop_pack8_avx((Mat *)&bottom_blob_shapes,(Mat *)&bottom_blobs_unpacked,_hoffset,
                                 _woffset);
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (pAVar7 == (Allocator *)0x0) {
                        if (bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          free(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start);
                        }
                      }
                      else {
                        (*pAVar7->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_e8 = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  iStack_110 = 0;
                  iStack_100 = 0;
                  iStack_fc = 0;
                  iStack_f8 = 0;
                  iStack_f4 = 0;
                  iStack_f0 = 0;
                  lVar45 = lVar45 + 1;
                } while (lVar45 < local_d0->c);
                iVar40 = 0;
                pMVar44 = local_d0;
                bottom_blobs = local_40;
              }
            }
          }
          piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          bVar49 = false;
        }
      }
      if (!bVar49) {
        return iVar40;
      }
    }
    if (local_c8 == 4) {
      uVar43 = local_b0 >> 3;
      sVar41 = 3;
      if ((_outc & 7U) != 0) {
        sVar41 = ((_outc & 3U) == 0) * '\x02';
      }
      uVar46 = _outh ^ local_c4 | _outw ^ local_d4;
      bVar48 = _outd == local_48;
      bVar49 = uVar46 == 0;
      if (bVar48 && bVar49) {
        iVar47 = 8;
        if ((_outc & 7U) != 0) {
          iVar47 = (uint)((_outc & 3U) == 0) * 3 + 1;
        }
        if (((_outc & 7U) != 0) || (_outc / iVar47 != local_b4)) goto LAB_00289f81;
        if (pMVar44 != pMVar2) {
          piVar4 = pMVar2->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = pMVar44->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = pMVar44->data;
              pAVar7 = pMVar44->allocator;
              if (pAVar7 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)_outc % (long)iVar47 & 0xffffffff)
                ;
              }
            }
          }
          pMVar44->cstep = 0;
          pMVar44->data = (void *)0x0;
          pMVar44->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar44->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar44->elemsize + 4) = 0;
          pMVar44->dims = 0;
          pMVar44->w = 0;
          pMVar44->h = 0;
          pMVar44->d = 0;
          pMVar44->c = 0;
          piVar4 = pMVar2->refcount;
          pMVar44->data = pMVar2->data;
          pMVar44->refcount = piVar4;
          pMVar44->elemsize = pMVar2->elemsize;
          pMVar44->elempack = pMVar2->elempack;
          pMVar44->allocator = pMVar2->allocator;
          iVar40 = pMVar2->w;
          iVar47 = pMVar2->h;
          iVar37 = pMVar2->d;
          pMVar44->dims = pMVar2->dims;
          pMVar44->w = iVar40;
          pMVar44->h = iVar47;
          pMVar44->d = iVar37;
          pMVar44->c = pMVar2->c;
          pMVar44->cstep = pMVar2->cstep;
        }
        bVar36 = false;
        iVar40 = 0;
      }
      else {
LAB_00289f81:
        bVar36 = true;
        if (((_coffset | _outc) & 7U) == 0) {
          iVar40 = _coffset + 7;
          if (-1 < _coffset) {
            iVar40 = _coffset;
          }
          iVar47 = _outc + 7;
          if (-1 < _outc) {
            iVar47 = _outc;
          }
          m.c = iVar47 >> 3;
          uVar8 = pMVar2->elemsize;
          m.data = (void *)((long)(iVar40 >> 3) * pMVar2->cstep * uVar8 + (long)pMVar2->data);
          m.elempack = pMVar2->elempack;
          m.allocator = pMVar2->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (int)uVar8;
          m.elemsize._4_4_ = (undefined4)(uVar8 >> 0x20);
          uVar28 = pMVar2->dims;
          uVar29 = pMVar2->w;
          uVar30 = pMVar2->h;
          uVar31 = pMVar2->d;
          m.cstep = ((long)pMVar2->d * uVar8 * (long)pMVar2->h * (long)pMVar2->w + 0xf &
                    0xfffffffffffffff0) / uVar8;
          m.dims = uVar28;
          m.w = uVar29;
          m.h = uVar30;
          m.d = uVar31;
          if (bVar48 && bVar49) {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_c0->blob_allocator,
                       CONCAT31((int3)(uVar46 >> 8),bVar48 && bVar49),m.allocator);
            pMVar44 = local_d0;
            if (local_d0 != (Mat *)&bottom_blob_shapes) {
              piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = local_d0->refcount;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (local_d0->allocator == (Allocator *)0x0) {
                    if (local_d0->data != (void *)0x0) {
                      free(local_d0->data);
                    }
                  }
                  else {
                    (*local_d0->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              pMVar44->cstep = 0;
              pMVar44->data = (void *)0x0;
              pMVar44->refcount = (int *)0x0;
              *(undefined8 *)((long)&pMVar44->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar44->elemsize + 4) = 0;
              pMVar44->dims = 0;
              pMVar44->w = 0;
              pMVar44->h = 0;
              pMVar44->d = 0;
              pMVar44->c = 0;
              pMVar44->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              pMVar44->refcount =
                   (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
              pMVar44->elemsize =
                   CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            (int)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
              pMVar44->elempack = iStack_110;
              pMVar44->allocator = pAStack_108;
              pMVar44->dims = iStack_100;
              pMVar44->w = iStack_fc;
              pMVar44->h = iStack_f8;
              pMVar44->d = iStack_f4;
              pMVar44->c = iStack_f0;
              pMVar44->cstep = local_e8;
            }
            piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (pAStack_108 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*pAStack_108->_vptr_Allocator[3])();
                }
              }
            }
            iVar40 = -100;
            if ((pMVar44->data != (void *)0x0) && ((long)pMVar44->c * pMVar44->cstep != 0))
            goto LAB_0028a1e4;
          }
          else {
LAB_0028a1e4:
            iVar40 = _outc + 7;
            if (-1 < _outc) {
              iVar40 = _outc;
            }
            Mat::create(pMVar44,_outw,_outh,_outd,iVar40 >> 3,uVar43 << sVar41,8,
                        local_c0->blob_allocator);
            iVar40 = -100;
            if ((pMVar44->data != (void *)0x0) && ((long)pMVar44->c * pMVar44->cstep != 0)) {
              if (pMVar44->c < 1) {
                iVar40 = 0;
              }
              else {
                lVar45 = 0;
                local_50 = &this->super_Crop;
                do {
                  if (0 < _outd) {
                    lVar42 = 0;
                    do {
                      pAVar38 = m.allocator;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start =
                           (pointer)((long)m.data +
                                    (long)(_doffset + (int)lVar42) *
                                    CONCAT44(m.elemsize._4_4_,(int)m.elemsize) *
                                    (long)m.h * (long)m.w +
                                    m.cstep * lVar45 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize));
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                      pAStack_108 = m.allocator;
                      sVar9 = local_d0->elemsize;
                      pAVar7 = local_d0->allocator;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           (pointer)((long)local_d0->data +
                                    lVar42 * sVar9 * (long)local_d0->h * (long)local_d0->w +
                                    local_d0->cstep * lVar45 * sVar9);
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)sVar9;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)(sVar9 >> 0x20);
                      crop_pack8_avx((Mat *)&bottom_blob_shapes,(Mat *)&bottom_blobs_unpacked,
                                     _hoffset,_woffset);
                      piVar4 = (int *)CONCAT44(bottom_blobs_unpacked.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                               bottom_blobs_unpacked.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                      if (piVar4 != (int *)0x0) {
                        LOCK();
                        *piVar4 = *piVar4 + -1;
                        UNLOCK();
                        if (*piVar4 == 0) {
                          if (pAVar7 == (Allocator *)0x0) {
                            if (bottom_blobs_unpacked.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_start != (pointer)0x0) {
                              free(bottom_blobs_unpacked.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start);
                            }
                          }
                          else {
                            (*pAVar7->_vptr_Allocator[3])();
                          }
                        }
                      }
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)0x0;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                      piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                               bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                      if (piVar4 != (int *)0x0) {
                        LOCK();
                        *piVar4 = *piVar4 + -1;
                        UNLOCK();
                        if (*piVar4 == 0) {
                          if (pAVar38 == (Allocator *)0x0) {
                            if (bottom_blob_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_start != (pointer)0x0) {
                              free(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start);
                            }
                          }
                          else {
                            (*pAVar38->_vptr_Allocator[3])();
                          }
                        }
                      }
                      local_e8 = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                      iStack_110 = 0;
                      iStack_100 = 0;
                      iStack_fc = 0;
                      iStack_f8 = 0;
                      iStack_f4 = 0;
                      iStack_f0 = 0;
                      lVar42 = lVar42 + 1;
                    } while (lVar42 < _outd);
                  }
                  lVar45 = lVar45 + 1;
                } while (lVar45 < local_d0->c);
                iVar40 = 0;
                pMVar44 = local_d0;
                this = (Crop_x86_avx512 *)local_50;
                bottom_blobs = local_40;
              }
            }
          }
          piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          bVar36 = false;
        }
      }
      if (!bVar36) {
        return iVar40;
      }
    }
  }
  if (local_44 != 4) goto LAB_0028b51e;
  if (local_c8 == 1) {
    uVar46 = _outw & 3;
    iVar47 = (uint)(uVar46 == 0) * 3 + 1;
    if (_outw / iVar47 == local_d4 && uVar46 == 0) {
      if (pMVar44 != pMVar2) {
        piVar4 = pMVar2->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = pMVar44->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar5 = pMVar44->data;
            pAVar7 = pMVar44->allocator;
            if (pAVar7 == (Allocator *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)_outw % (long)iVar47 & 0xffffffff);
            }
          }
        }
        pMVar44->cstep = 0;
        pMVar44->data = (void *)0x0;
        pMVar44->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar44->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar44->elemsize + 4) = 0;
        pMVar44->dims = 0;
        pMVar44->w = 0;
        pMVar44->h = 0;
        pMVar44->d = 0;
        pMVar44->c = 0;
        piVar4 = pMVar2->refcount;
        pMVar44->data = pMVar2->data;
        pMVar44->refcount = piVar4;
        pMVar44->elemsize = pMVar2->elemsize;
        pMVar44->elempack = pMVar2->elempack;
        pMVar44->allocator = pMVar2->allocator;
        iVar40 = pMVar2->w;
        iVar47 = pMVar2->h;
        iVar37 = pMVar2->d;
        pMVar44->dims = pMVar2->dims;
        pMVar44->w = iVar40;
        pMVar44->h = iVar47;
        pMVar44->d = iVar37;
        pMVar44->c = pMVar2->c;
        pMVar44->cstep = pMVar2->cstep;
      }
LAB_0028a6b2:
      bVar48 = false;
      iVar40 = 0;
    }
    else {
      bVar48 = true;
      if (((_outw | _woffset) & 3U) == 0) {
        Mat::create(pMVar44,_outw / iVar47,(local_b0 >> 2) << (uVar46 == 0) * '\x02',iVar47,
                    local_c0->blob_allocator);
        iVar40 = -100;
        if (pMVar44->data == (void *)0x0) {
          bVar48 = false;
        }
        else {
          bVar48 = false;
          if ((long)pMVar44->c * pMVar44->cstep != 0) {
            iVar40 = _woffset + 3;
            if (-1 < _woffset) {
              iVar40 = _woffset;
            }
            crop_pack4_sse(pMVar2,pMVar44,0,iVar40 >> 2);
            goto LAB_0028a6b2;
          }
        }
      }
    }
    if (!bVar48) {
      return iVar40;
    }
  }
  if (local_c8 == 2) {
    bVar48 = (_outh & 3U) == 0;
    iVar47 = (uint)bVar48 * 3 + 1;
    if (_outw == local_d4) {
      if (((_outh & 3U) != 0) || (_outh / iVar47 != local_c4)) goto LAB_0028a75d;
      if (pMVar44 != pMVar2) {
        piVar4 = pMVar2->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = pMVar44->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar5 = pMVar44->data;
            pAVar7 = pMVar44->allocator;
            if (pAVar7 == (Allocator *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)_outh % (long)iVar47 & 0xffffffff);
            }
          }
        }
        pMVar44->cstep = 0;
        pMVar44->data = (void *)0x0;
        pMVar44->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar44->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar44->elemsize + 4) = 0;
        pMVar44->dims = 0;
        pMVar44->w = 0;
        pMVar44->h = 0;
        pMVar44->d = 0;
        pMVar44->c = 0;
        piVar4 = pMVar2->refcount;
        pMVar44->data = pMVar2->data;
        pMVar44->refcount = piVar4;
        pMVar44->elemsize = pMVar2->elemsize;
        pMVar44->elempack = pMVar2->elempack;
        pMVar44->allocator = pMVar2->allocator;
        iVar40 = pMVar2->w;
        iVar47 = pMVar2->h;
        iVar37 = pMVar2->d;
        pMVar44->dims = pMVar2->dims;
        pMVar44->w = iVar40;
        pMVar44->h = iVar47;
        pMVar44->d = iVar37;
        pMVar44->c = pMVar2->c;
        pMVar44->cstep = pMVar2->cstep;
      }
LAB_0028a844:
      bVar49 = false;
      iVar40 = 0;
    }
    else {
LAB_0028a75d:
      bVar49 = true;
      if (((_hoffset | _outh) & 3U) == 0) {
        Mat::create(pMVar44,_outw,_outh / iVar47,(local_b0 >> 2) << bVar48 * '\x02',iVar47,
                    local_c0->blob_allocator);
        iVar40 = -100;
        if (pMVar44->data == (void *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = false;
          if ((long)pMVar44->c * pMVar44->cstep != 0) {
            iVar40 = _hoffset + 3;
            if (-1 < _hoffset) {
              iVar40 = _hoffset;
            }
            crop_pack4_sse(pMVar2,pMVar44,iVar40 >> 2,_woffset);
            goto LAB_0028a844;
          }
        }
      }
    }
    if (!bVar49) {
      return iVar40;
    }
  }
  if (local_c8 == 3) {
    bVar48 = (_outc & 3U) == 0;
    iVar47 = (uint)bVar48 * 3 + 1;
    uVar43 = local_b0 >> 2;
    bVar49 = _outh != local_c4 || _outw != local_d4;
    if (bVar49) {
LAB_0028a900:
      bVar36 = true;
      if (((_coffset | _outc) & 3U) == 0) {
        m.c = _outc / iVar47;
        uVar8 = pMVar2->elemsize;
        m.data = (void *)((long)(_coffset / iVar47) * pMVar2->cstep * uVar8 + (long)pMVar2->data);
        m.elempack = pMVar2->elempack;
        m.allocator = pMVar2->allocator;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = (int)uVar8;
        m.elemsize._4_4_ = (undefined4)(uVar8 >> 0x20);
        uVar19 = pMVar2->dims;
        uVar20 = pMVar2->w;
        uVar21 = pMVar2->h;
        uVar22 = pMVar2->d;
        m.cstep = ((long)pMVar2->d * uVar8 * (long)pMVar2->h * (long)pMVar2->w + 0xf &
                  0xfffffffffffffff0) / uVar8;
        m.dims = uVar19;
        m.w = uVar20;
        m.h = uVar21;
        m.d = uVar22;
        if (bVar49) {
LAB_0028ab58:
          Mat::create(pMVar44,_outw,_outh,_outc / iVar47,uVar43 << bVar48 * '\x02',iVar47,
                      local_c0->blob_allocator);
          iVar40 = -100;
          if ((pMVar44->data != (void *)0x0) && ((long)pMVar44->c * pMVar44->cstep != 0)) {
            if (pMVar44->c < 1) {
              iVar40 = 0;
            }
            else {
              lVar45 = 0;
              do {
                pAVar7 = m.allocator;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_start =
                     (pointer)(m.cstep * lVar45 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize) +
                              (long)m.data);
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish._0_4_ = 0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish._4_4_ = 0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                pAStack_108 = m.allocator;
                sVar9 = local_d0->elemsize;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     (pointer)(local_d0->cstep * lVar45 * sVar9 + (long)local_d0->data);
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)sVar9;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                     (undefined4)(sVar9 >> 0x20);
                crop_pack4_sse((Mat *)&bottom_blob_shapes,(Mat *)&bottom_blobs_unpacked,_hoffset,
                               _woffset);
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                         bottom_blob_shapes.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_finish._0_4_);
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + -1;
                  UNLOCK();
                  if (*piVar4 == 0) {
                    if (pAVar7 == (Allocator *)0x0) {
                      if (bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        free(bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start);
                      }
                    }
                    else {
                      (*pAVar7->_vptr_Allocator[3])();
                    }
                  }
                }
                local_e8 = 0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_start = (pointer)0x0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish._0_4_ = 0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish._4_4_ = 0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                iStack_110 = 0;
                iStack_100 = 0;
                iStack_fc = 0;
                iStack_f8 = 0;
                iStack_f4 = 0;
                iStack_f0 = 0;
                lVar45 = lVar45 + 1;
              } while (lVar45 < local_d0->c);
              iVar40 = 0;
              pMVar44 = local_d0;
              bottom_blobs = local_40;
            }
          }
        }
        else {
          Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_c0->blob_allocator,(int)m.elemsize,
                     m.allocator);
          pMVar44 = local_d0;
          if (local_d0 != (Mat *)&bottom_blob_shapes) {
            piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + 1;
              UNLOCK();
            }
            piVar4 = local_d0->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (local_d0->allocator == (Allocator *)0x0) {
                  if (local_d0->data != (void *)0x0) {
                    free(local_d0->data);
                  }
                }
                else {
                  (*local_d0->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pMVar44->cstep = 0;
            pMVar44->data = (void *)0x0;
            pMVar44->refcount = (int *)0x0;
            *(undefined8 *)((long)&pMVar44->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar44->elemsize + 4) = 0;
            pMVar44->dims = 0;
            pMVar44->w = 0;
            pMVar44->h = 0;
            pMVar44->d = 0;
            pMVar44->c = 0;
            pMVar44->data =
                 bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            pMVar44->refcount =
                 (int *)CONCAT44(bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish._4_4_,
                                 bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish._0_4_);
            pMVar44->elemsize =
                 CONCAT44(bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_,
                          (int)bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
            pMVar44->elempack = iStack_110;
            pMVar44->allocator = pAStack_108;
            pMVar44->dims = iStack_100;
            pMVar44->w = iStack_fc;
            pMVar44->h = iStack_f8;
            pMVar44->d = iStack_f4;
            pMVar44->c = iStack_f0;
            pMVar44->cstep = local_e8;
          }
          piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (pAStack_108 == (Allocator *)0x0) {
                if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start);
                }
              }
              else {
                (*pAStack_108->_vptr_Allocator[3])();
              }
            }
          }
          iVar40 = -100;
          if ((pMVar44->data != (void *)0x0) && ((long)pMVar44->c * pMVar44->cstep != 0))
          goto LAB_0028ab58;
        }
        piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m.cstep = 0;
        m.data = (void *)0x0;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = 0;
        m.elemsize._4_4_ = 0;
        m.elempack = 0;
        m.dims = 0;
        m.w = 0;
        m.h = 0;
        m.d = 0;
        m.c = 0;
        bVar36 = false;
      }
    }
    else {
      if (((_outc & 3U) != 0) || (_outc / iVar47 != local_b4)) goto LAB_0028a900;
      if (pMVar44 != pMVar2) {
        piVar4 = pMVar2->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = pMVar44->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar5 = pMVar44->data;
            pAVar7 = pMVar44->allocator;
            if (pAVar7 == (Allocator *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)_outc % (long)iVar47 & 0xffffffff);
            }
          }
        }
        pMVar44->cstep = 0;
        pMVar44->data = (void *)0x0;
        pMVar44->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar44->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar44->elemsize + 4) = 0;
        pMVar44->dims = 0;
        pMVar44->w = 0;
        pMVar44->h = 0;
        pMVar44->d = 0;
        pMVar44->c = 0;
        piVar4 = pMVar2->refcount;
        pMVar44->data = pMVar2->data;
        pMVar44->refcount = piVar4;
        pMVar44->elemsize = pMVar2->elemsize;
        pMVar44->elempack = pMVar2->elempack;
        pMVar44->allocator = pMVar2->allocator;
        iVar40 = pMVar2->w;
        iVar47 = pMVar2->h;
        iVar37 = pMVar2->d;
        pMVar44->dims = pMVar2->dims;
        pMVar44->w = iVar40;
        pMVar44->h = iVar47;
        pMVar44->d = iVar37;
        pMVar44->c = pMVar2->c;
        pMVar44->cstep = pMVar2->cstep;
      }
      bVar36 = false;
      iVar40 = 0;
    }
    if (!bVar36) {
      return iVar40;
    }
  }
  if (local_c8 != 4) goto LAB_0028b51e;
  bVar48 = (_outc & 3U) == 0;
  iVar47 = (uint)bVar48 * 3 + 1;
  uVar43 = local_b0 >> 2;
  if (((_outw == local_d4) && (_outh == local_c4)) && (_outd == local_48)) {
    if (((_outc & 3U) != 0) || (_outc / iVar47 != local_b4)) goto LAB_0028af50;
    if (pMVar44 != pMVar2) {
      piVar4 = pMVar2->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = pMVar44->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar5 = pMVar44->data;
          pAVar7 = pMVar44->allocator;
          if (pAVar7 == (Allocator *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)_outc % (long)iVar47 & 0xffffffff);
          }
        }
      }
      pMVar44->cstep = 0;
      pMVar44->data = (void *)0x0;
      pMVar44->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar44->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar44->elemsize + 4) = 0;
      pMVar44->dims = 0;
      pMVar44->w = 0;
      pMVar44->h = 0;
      pMVar44->d = 0;
      pMVar44->c = 0;
      piVar4 = pMVar2->refcount;
      pMVar44->data = pMVar2->data;
      pMVar44->refcount = piVar4;
      pMVar44->elemsize = pMVar2->elemsize;
      pMVar44->elempack = pMVar2->elempack;
      pMVar44->allocator = pMVar2->allocator;
      iVar40 = pMVar2->w;
      iVar47 = pMVar2->h;
      iVar37 = pMVar2->d;
      pMVar44->dims = pMVar2->dims;
      pMVar44->w = iVar40;
      pMVar44->h = iVar47;
      pMVar44->d = iVar37;
      pMVar44->c = pMVar2->c;
      pMVar44->cstep = pMVar2->cstep;
    }
    bVar49 = false;
    iVar40 = 0;
  }
  else {
LAB_0028af50:
    bVar49 = true;
    if (((_coffset | _outc) & 3U) == 0) {
      m.c = _outc / iVar47;
      uVar8 = pMVar2->elemsize;
      m.data = (void *)((long)(_coffset / iVar47) * pMVar2->cstep * uVar8 + (long)pMVar2->data);
      m.elempack = pMVar2->elempack;
      m.allocator = pMVar2->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (int)uVar8;
      m.elemsize._4_4_ = (undefined4)(uVar8 >> 0x20);
      uVar32 = pMVar2->dims;
      uVar33 = pMVar2->w;
      uVar34 = pMVar2->h;
      uVar35 = pMVar2->d;
      m.cstep = ((long)(int)uVar35 * uVar8 * (long)(int)uVar34 * (long)(int)uVar33 + 0xf &
                0xfffffffffffffff0) / uVar8;
      m.dims = uVar32;
      m.w = uVar33;
      m.h = uVar34;
      m.d = uVar35;
      if (((_outw == local_d4) && (_outh == local_c4)) && (_outd == local_48)) {
        Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_c0->blob_allocator,(int)m.elemsize,
                   pMVar2);
        if (pMVar44 != (Mat *)&bottom_blob_shapes) {
          piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = pMVar44->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (pMVar44->allocator == (Allocator *)0x0) {
                if (pMVar44->data != (void *)0x0) {
                  free(pMVar44->data);
                }
              }
              else {
                (*pMVar44->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar44->cstep = 0;
          pMVar44->data = (void *)0x0;
          pMVar44->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar44->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar44->elemsize + 4) = 0;
          pMVar44->dims = 0;
          pMVar44->w = 0;
          pMVar44->h = 0;
          pMVar44->d = 0;
          pMVar44->c = 0;
          pMVar44->data =
               bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start;
          pMVar44->refcount =
               (int *)CONCAT44(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish._4_4_,
                               bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish._0_4_);
          pMVar44->elemsize =
               CONCAT44(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                        (int)bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
          pMVar44->elempack = iStack_110;
          pMVar44->allocator = pAStack_108;
          pMVar44->dims = iStack_100;
          pMVar44->w = iStack_fc;
          pMVar44->h = iStack_f8;
          pMVar44->d = iStack_f4;
          pMVar44->c = iStack_f0;
          pMVar44->cstep = local_e8;
        }
        piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish._4_4_,
                                 bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (pAStack_108 == (Allocator *)0x0) {
              if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              (*pAStack_108->_vptr_Allocator[3])();
            }
          }
        }
        iVar40 = -100;
        if ((pMVar44->data != (void *)0x0) && ((long)pMVar44->c * pMVar44->cstep != 0))
        goto LAB_0028b1cc;
      }
      else {
LAB_0028b1cc:
        Mat::create(pMVar44,_outw,_outh,_outd,_outc / iVar47,uVar43 << bVar48 * '\x02',iVar47,
                    local_c0->blob_allocator);
        iVar40 = -100;
        if ((pMVar44->data != (void *)0x0) && ((long)pMVar44->c * pMVar44->cstep != 0)) {
          if (pMVar44->c < 1) {
            iVar40 = 0;
          }
          else {
            lVar45 = 0;
            local_50 = &this->super_Crop;
            do {
              if (0 < _outd) {
                lVar42 = 0;
                do {
                  pAVar38 = m.allocator;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)((long)m.data +
                                (long)(_doffset + (int)lVar42) *
                                CONCAT44(m.elemsize._4_4_,(int)m.elemsize) * (long)m.h * (long)m.w +
                                m.cstep * lVar45 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize));
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                  sVar9 = local_d0->elemsize;
                  pAVar7 = local_d0->allocator;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)((long)local_d0->data +
                                (long)local_d0->h * sVar9 * lVar42 * local_d0->w +
                                local_d0->cstep * lVar45 * sVar9);
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)sVar9;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                       (undefined4)(sVar9 >> 0x20);
                  crop_pack4_sse((Mat *)&bottom_blob_shapes,(Mat *)&bottom_blobs_unpacked,_hoffset,
                                 _woffset);
                  piVar4 = (int *)CONCAT44(bottom_blobs_unpacked.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           bottom_blobs_unpacked.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (pAVar7 == (Allocator *)0x0) {
                        if (bottom_blobs_unpacked.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          free(bottom_blobs_unpacked.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start);
                        }
                      }
                      else {
                        (*pAVar7->_vptr_Allocator[3])();
                      }
                    }
                  }
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (pAVar38 == (Allocator *)0x0) {
                        if (bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          free(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start);
                        }
                      }
                      else {
                        (*pAVar38->_vptr_Allocator[3])();
                      }
                    }
                  }
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  lVar42 = lVar42 + 1;
                } while (lVar42 < _outd);
              }
              lVar45 = lVar45 + 1;
            } while (lVar45 < local_d0->c);
            iVar40 = 0;
            this = (Crop_x86_avx512 *)local_50;
            bottom_blobs = local_40;
          }
        }
      }
      piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      bVar49 = false;
    }
  }
  if (!bVar49) {
    return iVar40;
  }
LAB_0028b51e:
  local_50 = &this->super_Crop;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&bottom_blobs_unpacked,
             ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,
             (allocator_type *)&m);
  bVar48 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_finish !=
           (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_d0._0_4_ = iVar40;
  if (bVar48) {
    lVar45 = 0;
    uVar43 = 0;
    do {
      pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar1 = (undefined8 *)((long)&pMVar3->data + lVar45);
      m.data = (void *)*puVar1;
      piVar4 = (int *)puVar1[1];
      m.refcount._0_4_ = SUB84(piVar4,0);
      m.refcount._4_4_ = (undefined4)((ulong)piVar4 >> 0x20);
      uVar10 = *(undefined8 *)((long)&pMVar3->elemsize + lVar45);
      m.elemsize._0_4_ = (int)uVar10;
      m.elemsize._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
      m.elempack = *(int *)((long)&pMVar3->elempack + lVar45);
      m.allocator = *(Allocator **)((long)&pMVar3->allocator + lVar45);
      puVar1 = (undefined8 *)((long)&pMVar3->dims + lVar45);
      uVar10 = *puVar1;
      uVar23 = puVar1[1];
      m.dims = (int)uVar10;
      m.w = (int)((ulong)uVar10 >> 0x20);
      m.h = (int)uVar23;
      m.d = (int)((ulong)uVar23 >> 0x20);
      m.c = *(int *)((long)&pMVar3->c + lVar45);
      m.cstep = *(size_t *)((long)&pMVar3->cstep + lVar45);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      if (local_44 == 1) {
LAB_0028b64f:
        pMVar3 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pMVar2 = (Mat *)((long)&(bottom_blobs_unpacked.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_start)->data + lVar45);
        bVar49 = true;
        if (pMVar2 != &m) {
          piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = *(int **)((long)&(bottom_blobs_unpacked.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->refcount + lVar45);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = *(void **)((long)&(bottom_blobs_unpacked.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->data + lVar45);
              plVar6 = *(long **)((long)&(bottom_blobs_unpacked.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->allocator +
                                 lVar45);
              if (plVar6 == (long *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (**(code **)(*plVar6 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&pMVar3->cstep + lVar45) = 0;
          *(undefined8 *)((long)&pMVar2->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar2->elemsize + 4) = 0;
          pMVar2->data = (void *)0x0;
          pMVar2->refcount = (int *)0x0;
          puVar1 = (undefined8 *)((long)&pMVar3->dims + lVar45);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)((long)&pMVar3->c + lVar45) = 0;
          puVar1 = (undefined8 *)((long)&pMVar3->data + lVar45);
          *puVar1 = m.data;
          puVar1[1] = CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          *(ulong *)((long)&pMVar3->elemsize + lVar45) = CONCAT44(m.elemsize._4_4_,(int)m.elemsize);
          *(int *)((long)&pMVar3->elempack + lVar45) = m.elempack;
          *(Allocator **)((long)&pMVar3->allocator + lVar45) = m.allocator;
          puVar1 = (undefined8 *)((long)&pMVar3->dims + lVar45);
          *puVar1 = CONCAT44(m.w,m.dims);
          puVar1[1] = CONCAT44(m.d,m.h);
          *(int *)((long)&pMVar3->c + lVar45) = m.c;
          *(size_t *)((long)&pMVar3->cstep + lVar45) = m.cstep;
        }
      }
      else {
        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)local_c0;
        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = (int)local_c0->workspace_allocator;
        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             (undefined4)((ulong)local_c0->workspace_allocator >> 0x20);
        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = SUB84(local_c0->workspace_allocator,0);
        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ =
             (undefined4)((ulong)local_c0->workspace_allocator >> 0x20);
        convert_packing((Mat *)((long)&((bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_start)->data + lVar45),&m
                        ,1,(Option *)&bottom_blob_shapes);
        if (m.data != (void *)0x0 && (long)m.c * m.cstep != 0) goto LAB_0028b64f;
        local_d0._0_4_ = -100;
        bVar49 = false;
      }
      bottom_blobs = local_40;
      piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      if (!bVar49) break;
      uVar43 = uVar43 + 1;
      lVar45 = lVar45 + 0x48;
      bVar48 = uVar43 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x71c71c71c71c71c7);
    } while (bVar48);
  }
  iVar40 = (int)local_d0;
  if (!bVar48) {
    iVar40 = Crop::forward(local_50,&bottom_blobs_unpacked,local_38,local_c0);
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blobs_unpacked);
  return iVar40;
}

Assistant:

int Crop_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    Mat& top_blob = top_blobs[0];

#if __SSE2__
    int _woffset, _hoffset, _doffset, _coffset;
    int _outw, _outh, _outd, _outc;
    if (!starts_expr.empty() && !ends_expr.empty())
    {
        std::vector<Mat> bottom_blob_shapes(bottom_blobs.size());
        for (size_t i = 0; i < bottom_blobs.size(); i++)
        {
            bottom_blob_shapes[i] = bottom_blobs[i].shape();
        }
        eval_crop_expr(bottom_blob_shapes, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else if (woffset == -233)
    {
        resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    std::vector<Mat> bottom_blobs_unpacked(bottom_blobs.size());
    for (size_t i = 0; i < bottom_blobs.size(); i++)
    {
        Mat bottom_blob_unpacked = bottom_blobs[i];
        if (elempack != 1)
        {
            Option opt_pack1 = opt;
            opt_pack1.blob_allocator = opt.workspace_allocator;

            convert_packing(bottom_blobs[i], bottom_blob_unpacked, 1, opt_pack1);
            if (bottom_blob_unpacked.empty())
                return -100;
        }

        bottom_blobs_unpacked[i] = bottom_blob_unpacked;
    }

    return Crop::forward(bottom_blobs_unpacked, top_blobs, opt);
}